

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * lest::to_string<(anonymous_namespace)::Implicit>
                   (string *__return_storage_ptr__,Implicit *value)

{
  uint *puVar1;
  int iVar2;
  ostream *this;
  ostringstream os;
  string asStack_1d8 [32];
  string local_1b8 [32];
  long local_198 [3];
  uint auStack_180 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  iVar2 = value->x;
  this = std::operator<<((ostream *)local_198,"Implicit:");
  std::ostream::operator<<((ostream *)this,iVar2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string(asStack_1d8,local_1b8);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::__cxx11::string::string((string *)__return_storage_ptr__,asStack_1d8);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}